

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O3

void duckdb::UnionVector::SetToMember
               (Vector *union_vector,union_tag_t tag,Vector *member_vector,idx_t count,
               bool keep_tags_for_null)

{
  buffer_ptr<ValidityBuffer> *other;
  unsigned_long *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  Vector *pVVar5;
  TemplatedValidityData<unsigned_long> *pTVar6;
  idx_t iVar7;
  idx_t iVar8;
  undefined7 in_register_00000031;
  _Head_base<0UL,_unsigned_long_*,_false> _Var9;
  ulong member_index;
  ulong uVar10;
  bool bVar11;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  idx_t local_40;
  idx_t local_38;
  
  member_index = CONCAT71(in_register_00000031,tag) & 0xffffffff;
  local_40 = count;
  pVVar5 = GetMember(union_vector,member_index);
  Vector::Reference(pVVar5,member_vector);
  pVVar5 = GetTags(union_vector);
  iVar7 = local_40;
  if (member_vector->vector_type == CONSTANT_VECTOR) {
    Vector::SetVectorType(union_vector,CONSTANT_VECTOR);
    *pVVar5->data = tag;
    if (keep_tags_for_null) {
      puVar1 = (union_vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar1 != (unsigned_long *)0x0) {
        *(byte *)puVar1 = (byte)*puVar1 | 1;
      }
      puVar1 = (pVVar5->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar1 != (unsigned_long *)0x0) {
        *(byte *)puVar1 = (byte)*puVar1 | 1;
      }
    }
    else {
      puVar1 = (member_vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        bVar11 = false;
      }
      else {
        bVar11 = (*puVar1 & 1) == 0;
      }
      ConstantVector::SetNull(union_vector,bVar11);
      puVar1 = (member_vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        bVar11 = false;
      }
      else {
        bVar11 = (*puVar1 & 1) == 0;
      }
      ConstantVector::SetNull(pVVar5,bVar11);
    }
  }
  else {
    Vector::Flatten(member_vector,local_40);
    Vector::SetVectorType(union_vector,FLAT_VECTOR);
    if ((member_vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      Vector::SetVectorType(pVVar5,CONSTANT_VECTOR);
      *pVVar5->data = tag;
    }
    else {
      Vector::SetVectorType(pVVar5,FLAT_VECTOR);
      if (keep_tags_for_null) {
        FlatVector::VerifyFlatVector(pVVar5);
        _Var9._M_head_impl =
             (pVVar5->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (_Var9._M_head_impl == (unsigned_long *)0x0) {
          local_38 = (pVVar5->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_58,&local_38);
          p_Var4 = p_Stack_50;
          peVar3 = local_58;
          local_58 = (element_type *)0x0;
          p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var2 = (pVVar5->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (pVVar5->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar3;
          (pVVar5->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var4;
          if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
            if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
            }
          }
          pTVar6 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                             (&(pVVar5->validity).super_TemplatedValidityMask<unsigned_long>.
                               validity_data);
          _Var9._M_head_impl =
               (pTVar6->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          (pVVar5->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               _Var9._M_head_impl;
        }
        if (iVar7 != 0) {
          uVar10 = iVar7 + 0x3f >> 6;
          if (uVar10 != 1) {
            switchD_010444a0::default(_Var9._M_head_impl,0xff,uVar10 * 8 - 8);
          }
          (_Var9._M_head_impl + 0xffffffffffffffff)[uVar10] =
               (_Var9._M_head_impl + 0xffffffffffffffff)[uVar10] |
               -(ulong)((iVar7 & 0x3f) == 0) | ~(-1L << ((byte)iVar7 & 0x3f));
        }
        FlatVector::VerifyFlatVector(union_vector);
        _Var9._M_head_impl =
             (union_vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (_Var9._M_head_impl == (unsigned_long *)0x0) {
          local_38 = (union_vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_58,&local_38);
          p_Var4 = p_Stack_50;
          peVar3 = local_58;
          local_58 = (element_type *)0x0;
          p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var2 = (union_vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data
                   .internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (union_vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal
          .
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar3;
          (union_vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal
          .
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var4;
          if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
            if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
            }
          }
          pTVar6 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                             (&(union_vector->validity).super_TemplatedValidityMask<unsigned_long>.
                               validity_data);
          _Var9._M_head_impl =
               (pTVar6->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          (union_vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               _Var9._M_head_impl;
        }
        if (iVar7 != 0) {
          uVar10 = iVar7 + 0x3f >> 6;
          if (uVar10 != 1) {
            switchD_010444a0::default(_Var9._M_head_impl,0xff,uVar10 * 8 - 8);
          }
          _Var9._M_head_impl[uVar10 - 1] =
               _Var9._M_head_impl[uVar10 - 1] |
               -(ulong)((iVar7 & 0x3f) == 0) | ~(-1L << ((byte)iVar7 & 0x3f));
        }
      }
      else {
        FlatVector::VerifyFlatVector(member_vector);
        FlatVector::VerifyFlatVector(union_vector);
        (union_vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (member_vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        other = &(member_vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  (&(union_vector->validity).super_TemplatedValidityMask<unsigned_long>.
                    validity_data,other);
        (union_vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
             (member_vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
        FlatVector::VerifyFlatVector(member_vector);
        FlatVector::VerifyFlatVector(pVVar5);
        (pVVar5->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (member_vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  (&(pVVar5->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                   other);
        (pVVar5->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
             (member_vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
      }
      switchD_010444a0::default(pVVar5->data,(uint)CONCAT71(in_register_00000031,tag) & 0xff,iVar7);
    }
  }
  iVar7 = UnionType::GetMemberCount(&union_vector->type);
  if (iVar7 != 0) {
    iVar7 = 0;
    do {
      if (member_index != iVar7) {
        pVVar5 = GetMember(union_vector,iVar7);
        Vector::SetVectorType(pVVar5,CONSTANT_VECTOR);
        ConstantVector::SetNull(pVVar5,true);
      }
      iVar7 = iVar7 + 1;
      iVar8 = UnionType::GetMemberCount(&union_vector->type);
    } while (iVar7 < iVar8);
  }
  return;
}

Assistant:

void UnionVector::SetToMember(Vector &union_vector, union_tag_t tag, Vector &member_vector, idx_t count,
                              bool keep_tags_for_null) {
	D_ASSERT(union_vector.GetType().id() == LogicalTypeId::UNION);
	D_ASSERT(tag < UnionType::GetMemberCount(union_vector.GetType()));

	// Set the union member to the specified vector
	UnionVector::GetMember(union_vector, tag).Reference(member_vector);
	auto &tag_vector = UnionVector::GetTags(union_vector);

	if (member_vector.GetVectorType() == VectorType::CONSTANT_VECTOR) {
		// if the member vector is constant, we can set the union to constant as well
		union_vector.SetVectorType(VectorType::CONSTANT_VECTOR);
		ConstantVector::GetData<union_tag_t>(tag_vector)[0] = tag;
		if (keep_tags_for_null) {
			ConstantVector::SetNull(union_vector, false);
			ConstantVector::SetNull(tag_vector, false);
		} else {
			ConstantVector::SetNull(union_vector, ConstantVector::IsNull(member_vector));
			ConstantVector::SetNull(tag_vector, ConstantVector::IsNull(member_vector));
		}

	} else {
		// otherwise flatten and set to flatvector
		member_vector.Flatten(count);
		union_vector.SetVectorType(VectorType::FLAT_VECTOR);

		if (member_vector.validity.AllValid()) {
			// if the member vector is all valid, we can set the tag to constant
			tag_vector.SetVectorType(VectorType::CONSTANT_VECTOR);
			auto tag_data = ConstantVector::GetData<union_tag_t>(tag_vector);
			*tag_data = tag;
		} else {
			tag_vector.SetVectorType(VectorType::FLAT_VECTOR);
			if (keep_tags_for_null) {
				FlatVector::Validity(tag_vector).SetAllValid(count);
				FlatVector::Validity(union_vector).SetAllValid(count);
			} else {
				// ensure the tags have the same validity as the member
				FlatVector::Validity(union_vector) = FlatVector::Validity(member_vector);
				FlatVector::Validity(tag_vector) = FlatVector::Validity(member_vector);
			}

			auto tag_data = FlatVector::GetData<union_tag_t>(tag_vector);
			memset(tag_data, tag, count);
		}
	}

	// Set the non-selected members to constant null vectors
	for (idx_t i = 0; i < UnionType::GetMemberCount(union_vector.GetType()); i++) {
		if (i != tag) {
			auto &member = UnionVector::GetMember(union_vector, i);
			member.SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(member, true);
		}
	}
}